

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

Result __thiscall
doctest::detail::Expression_lhs<std::__cxx11::string_const&>::operator==
          (Expression_lhs<std::__cxx11::string_const&> *this,char (*rhs) [3])

{
  int iVar1;
  void *in_RAX;
  char (*in_RDX) [3];
  EVP_PKEY_CTX *src;
  String extraout_RDX;
  Result RVar2;
  void *local_28;
  
  local_28 = in_RAX;
  iVar1 = std::__cxx11::string::compare(*(char **)rhs);
  stringifyBinaryExpr<std::__cxx11::string,char[3]>
            ((detail *)&local_28,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)rhs," == ",
             in_RDX);
  *this = (Expression_lhs<std::__cxx11::string_const&>)(iVar1 == 0);
  *(undefined8 *)(this + 8) = 0;
  String::copy((String *)(this + 8),(EVP_PKEY_CTX *)&local_28,src);
  free(local_28);
  RVar2.m_decomposition.m_str = extraout_RDX.m_str;
  RVar2._0_8_ = this;
  return RVar2;
}

Assistant:

Result operator<=(const DOCTEST_REF_WRAP(R) rhs) { return Result(lhs <= rhs, stringifyBinaryExpr(lhs, " <= ", rhs)); }